

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_context.cpp
# Opt level: O3

void __thiscall
TransactionContext_SequenceApiTestWithKey_Test::TestBody
          (TransactionContext_SequenceApiTestWithKey_Test *this)

{
  pointer pcVar1;
  Txid *this_00;
  void *pvVar2;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  Amount AVar6;
  initializer_list<cfd::UtxoData> __l;
  AssertionResult gtest_ar;
  ByteData tx;
  Amount fee;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  AddressFactory factory;
  TransactionContext txc;
  AssertionResult gtest_ar_1;
  Address address;
  UtxoData utxo2;
  UtxoData utxo1;
  Address address2;
  undefined1 local_1988 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1980;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1978;
  Privkey local_1960;
  Pubkey local_1940;
  string local_1928;
  ByteData local_1908;
  Amount local_18f0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_18e0;
  SigHashType local_18c8;
  SigHashType local_18bc;
  AddressFactory local_18b0;
  TransactionContext local_1888;
  undefined1 local_17d0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_17c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_17c0 [81];
  UtxoData local_12a8;
  undefined1 local_d80 [384];
  undefined1 local_c00 [40];
  Txid local_bd8;
  uint32_t local_bb8;
  Script local_bb0 [2];
  Address local_b40;
  undefined1 local_9c0 [8];
  char *local_9b8;
  Amount local_9a0;
  AddressType local_990;
  void *local_988;
  UtxoData local_6d8;
  Address local_1b0;
  
  cfd::AddressFactory::AddressFactory(&local_18b0,kRegtest);
  cfd::UtxoData::UtxoData(&local_6d8);
  local_6d8.block_height = 0;
  local_6d8.binary_data = (void *)0x0;
  pcVar1 = local_c00 + 0x10;
  local_c00._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c00,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             "");
  cfd::core::Txid::Txid((Txid *)local_17d0,(string *)local_c00);
  this_00 = &local_6d8.txid;
  cfd::core::Txid::operator=(this_00,(Txid *)local_17d0);
  local_17d0 = (undefined1  [8])&PTR__Txid_0086d9f8;
  pvVar2 = (void *)CONCAT71(local_17c8.ptr_._1_7_,local_17c8.ptr_._0_1_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_17c0[0]._8_8_ - (long)pvVar2);
  }
  if ((pointer)local_c00._0_8_ != pcVar1) {
    operator_delete((void *)local_c00._0_8_,local_c00._16_8_ + 1);
  }
  local_6d8.vout = 0;
  local_c00._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c00,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac","");
  cfd::core::Script::Script((Script *)local_17d0,(string *)local_c00);
  cfd::core::Script::operator=(&local_6d8.locking_script,(Script *)local_17d0);
  cfd::core::Script::~Script((Script *)local_17d0);
  if ((pointer)local_c00._0_8_ != pcVar1) {
    operator_delete((void *)local_c00._0_8_,local_c00._16_8_ + 1);
  }
  local_c00._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c00,"n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW","");
  cfd::AddressFactory::GetAddress((Address *)local_17d0,&local_18b0,(string *)local_c00);
  cfd::core::Address::operator=(&local_6d8.address,(Address *)local_17d0);
  cfd::core::Address::~Address((Address *)local_17d0);
  if ((pointer)local_c00._0_8_ != pcVar1) {
    operator_delete((void *)local_c00._0_8_,local_c00._16_8_ + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_6d8.descriptor,0,(char *)local_6d8.descriptor._M_string_length,0x5b667b);
  cfd::core::Amount::Amount((Amount *)local_17d0,10000000);
  local_6d8.amount.ignore_check_ = local_17c8.ptr_._0_1_;
  local_6d8.amount.amount_ = (int64_t)local_17d0;
  local_6d8.address_type = kP2pkhAddress;
  cfd::UtxoData::UtxoData((UtxoData *)local_c00);
  local_c00._0_8_ = (pointer)0x0;
  local_988 = (void *)0x0;
  pcVar1 = local_d80 + 0x10;
  local_d80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d80,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",
             "");
  cfd::core::Txid::Txid((Txid *)local_17d0,(string *)local_d80);
  cfd::core::Txid::operator=(&local_bd8,(Txid *)local_17d0);
  local_17d0 = (undefined1  [8])&PTR__Txid_0086d9f8;
  pvVar2 = (void *)CONCAT71(local_17c8.ptr_._1_7_,local_17c8.ptr_._0_1_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_17c0[0]._8_8_ - (long)pvVar2);
  }
  if ((pointer)local_d80._0_8_ != pcVar1) {
    operator_delete((void *)local_d80._0_8_,local_d80._16_8_ + 1);
  }
  local_bb8 = 0;
  local_d80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d80,"a9145d54db96a28f844a744e393fcd699d6f825b284187","");
  cfd::core::Script::Script((Script *)local_17d0,(string *)local_d80);
  cfd::core::Script::operator=(local_bb0,(Script *)local_17d0);
  cfd::core::Script::~Script((Script *)local_17d0);
  if ((pointer)local_d80._0_8_ != pcVar1) {
    operator_delete((void *)local_d80._0_8_,local_d80._16_8_ + 1);
  }
  local_d80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d80,"2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16","");
  cfd::AddressFactory::GetAddress((Address *)local_17d0,&local_18b0,(string *)local_d80);
  cfd::core::Address::operator=(&local_b40,(Address *)local_17d0);
  cfd::core::Address::~Address((Address *)local_17d0);
  if ((pointer)local_d80._0_8_ != pcVar1) {
    operator_delete((void *)local_d80._0_8_,local_d80._16_8_ + 1);
  }
  std::__cxx11::string::_M_replace((ulong)local_9c0,0,local_9b8,0x57b2c5);
  cfd::core::Amount::Amount((Amount *)local_17d0,180000);
  local_9a0.ignore_check_ = local_17c8.ptr_._0_1_;
  local_9a0.amount_ = (int64_t)local_17d0;
  local_990 = kP2shP2wpkhAddress;
  local_17d0 = (undefined1  [8])local_17c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17d0,"mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo","");
  cfd::core::Address::Address((Address *)local_d80,(string *)local_17d0);
  if (local_17d0 != (undefined1  [8])local_17c0) {
    operator_delete((void *)local_17d0,(ulong)(local_17c0[0]._M_allocated_capacity + 1));
  }
  local_17d0 = (undefined1  [8])local_17c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17d0,"bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu","");
  cfd::core::Address::Address(&local_1b0,(string *)local_17d0);
  if (local_17d0 != (undefined1  [8])local_17c0) {
    operator_delete((void *)local_17d0,(ulong)(local_17c0[0]._M_allocated_capacity + 1));
  }
  cfd::core::Amount::Amount(&local_18f0,10000);
  cfd::TransactionContext::TransactionContext(&local_1888,2,0);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::TransactionContext::AddInput(&local_1888,&local_6d8);
    }
  }
  else {
    testing::Message::Message((Message *)local_17d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1988,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1b4,
               "Expected: txc.AddInput(utxo1) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1988,(Message *)local_17d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1988);
    if (local_17d0 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_17d0 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_17d0 + 8))();
      }
    }
  }
  cfd::core::OutPoint::OutPoint((OutPoint *)local_17d0,&local_bd8,local_bb8);
  cfd::TransactionContext::AddTxIn(&local_1888,(OutPoint *)local_17d0);
  local_17d0 = (undefined1  [8])&PTR__Txid_0086d9f8;
  pvVar2 = (void *)CONCAT71(local_17c8.ptr_._1_7_,local_17c8.ptr_._0_1_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_17c0[0]._8_8_ - (long)pvVar2);
  }
  AVar6 = cfd::core::operator-(&local_6d8.amount,&local_18f0);
  local_17d0 = (undefined1  [8])AVar6.amount_;
  local_17c8.ptr_._0_1_ = AVar6.ignore_check_;
  cfd::TransactionContext::AddTxOut(&local_1888,(Address *)local_d80,(Amount *)local_17d0);
  cfd::TransactionContext::AddTxOut(&local_1888,&local_1b0,&local_9a0);
  cfd::UtxoData::UtxoData((UtxoData *)local_17d0,&local_6d8);
  cfd::UtxoData::UtxoData(&local_12a8,(UtxoData *)local_c00);
  __l._M_len = 2;
  __l._M_array = (iterator)local_17d0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&local_18e0,__l,(allocator_type *)local_1988);
  lVar5 = 0x528;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(local_17d0 + lVar5));
    lVar5 = lVar5 + -0x528;
  } while (lVar5 != -0x528);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::TransactionContext::CollectInputUtxo(&local_1888,&local_18e0);
    }
  }
  else {
    testing::Message::Message((Message *)local_17d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1988,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1ba,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1988,(Message *)local_17d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1988);
    if (local_17d0 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_17d0 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_17d0 + 8))();
      }
    }
  }
  cfd::core::ByteData::ByteData(&local_1908);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_17d0,this_00,local_6d8.vout);
      local_1988 = (undefined1  [8])&local_1978;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1988,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_1940,(string *)local_1988);
      local_1928._M_dataplus._M_p = (pointer)&local_1928.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1928,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif(&local_1960,&local_1928,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_18bc);
      cfd::TransactionContext::SignWithKey
                (&local_1888,(OutPoint *)local_17d0,&local_1940,&local_1960,&local_18bc,true,
                 (ByteData256 *)0x0,(ByteData *)0x0);
      if (local_1960.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1960.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1960.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1960.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1928._M_dataplus._M_p != &local_1928.field_2) {
        operator_delete(local_1928._M_dataplus._M_p,local_1928.field_2._M_allocated_capacity + 1);
      }
      if (local_1940.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1940.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1940.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1940.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1988 != (undefined1  [8])&local_1978) {
        operator_delete((void *)local_1988,local_1978._M_allocated_capacity + 1);
      }
      local_17d0 = (undefined1  [8])&PTR__Txid_0086d9f8;
      pvVar2 = (void *)CONCAT71(local_17c8.ptr_._1_7_,local_17c8.ptr_._0_1_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_17c0[0]._8_8_ - (long)pvVar2);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_17d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1988,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1c1,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1988,(Message *)local_17d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1988);
    if (local_17d0 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_17d0 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_17d0 + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_17d0,this_00,local_6d8.vout);
      cfd::TransactionContext::Verify(&local_1888,(OutPoint *)local_17d0);
      local_17d0 = (undefined1  [8])&PTR__Txid_0086d9f8;
      pvVar2 = (void *)CONCAT71(local_17c8.ptr_._1_7_,local_17c8.ptr_._0_1_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_17c0[0]._8_8_ - (long)pvVar2);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_17d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1988,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1c2,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1988,(Message *)local_17d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1988);
    if (local_17d0 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_17d0 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_17d0 + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    cfd::TransactionContext::Finalize((ByteData *)local_17d0,&local_1888);
    cfd::core::ByteData::operator=(&local_1908,(ByteData *)local_17d0);
    if (local_17d0 != (undefined1  [8])0x0) {
      operator_delete((void *)local_17d0,local_17c0[0]._M_allocated_capacity - (long)local_17d0);
    }
  }
  testing::Message::Message((Message *)local_17d0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_1988,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
             ,0x1c4,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_1988,(Message *)local_17d0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1988);
  if (local_17d0 != (undefined1  [8])0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) && (local_17d0 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_17d0 + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_17d0,&local_bd8,local_bb8);
      local_1988 = (undefined1  [8])&local_1978;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1988,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27","");
      cfd::core::Pubkey::Pubkey(&local_1940,(string *)local_1988);
      local_1928._M_dataplus._M_p = (pointer)&local_1928.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1928,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP","");
      cfd::core::Privkey::FromWif(&local_1960,&local_1928,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_18c8);
      cfd::TransactionContext::SignWithKey
                (&local_1888,(OutPoint *)local_17d0,&local_1940,&local_1960,&local_18c8,true,
                 (ByteData256 *)0x0,(ByteData *)0x0);
      if (local_1960.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1960.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1960.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1960.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1928._M_dataplus._M_p != &local_1928.field_2) {
        operator_delete(local_1928._M_dataplus._M_p,local_1928.field_2._M_allocated_capacity + 1);
      }
      if (local_1940.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1940.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1940.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1940.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1988 != (undefined1  [8])&local_1978) {
        operator_delete((void *)local_1988,local_1978._M_allocated_capacity + 1);
      }
      local_17d0 = (undefined1  [8])&PTR__Txid_0086d9f8;
      pvVar2 = (void *)CONCAT71(local_17c8.ptr_._1_7_,local_17c8.ptr_._0_1_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_17c0[0]._8_8_ - (long)pvVar2);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_17d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1988,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1c9,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1988,(Message *)local_17d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1988);
    if (local_17d0 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_17d0 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_17d0 + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_17d0,&local_bd8,local_bb8);
      cfd::TransactionContext::Verify(&local_1888,(OutPoint *)local_17d0);
      local_17d0 = (undefined1  [8])&PTR__Txid_0086d9f8;
      pvVar2 = (void *)CONCAT71(local_17c8.ptr_._1_7_,local_17c8.ptr_._0_1_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_17c0[0]._8_8_ - (long)pvVar2);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_17d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1988,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1ca,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1988,(Message *)local_17d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1988);
    if (local_17d0 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_17d0 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_17d0 + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::TransactionContext::Finalize((ByteData *)local_17d0,&local_1888);
      cfd::core::ByteData::operator=(&local_1908,(ByteData *)local_17d0);
      if (local_17d0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_17d0,local_17c0[0]._M_allocated_capacity - (long)local_17d0);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_17d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1988,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1cb,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1988,(Message *)local_17d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1988);
    if (local_17d0 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_17d0 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_17d0 + 8))();
      }
    }
  }
  AVar6 = cfd::TransactionContext::GetFeeAmount(&local_1888);
  local_1988 = (undefined1  [8])AVar6.amount_;
  local_1980.ptr_._0_1_ = AVar6.ignore_check_;
  local_1960.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)cfd::core::Amount::GetSatoshiValue((Amount *)local_1988);
  local_1928._M_dataplus._M_p = (pointer)cfd::core::Amount::GetSatoshiValue(&local_18f0);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_17d0,"txc.GetFeeAmount().GetSatoshiValue()","fee.GetSatoshiValue()",
             (long *)&local_1960,(long *)&local_1928);
  if (local_17d0[0] == (string)0x0) {
    testing::Message::Message((Message *)local_1988);
    if ((undefined8 *)CONCAT71(local_17c8.ptr_._1_7_,local_17c8.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT71(local_17c8.ptr_._1_7_,local_17c8.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1960,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1cc,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1960,(Message *)local_1988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1960);
    if (local_1988 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_1988 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_1988 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_17c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_17d0,&local_1908);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1988,"tx.GetHex().c_str()",
             "\"02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000\""
             ,(char *)local_17d0,
             "02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000"
            );
  if (local_17d0 != (undefined1  [8])local_17c0) {
    operator_delete((void *)local_17d0,(ulong)(local_17c0[0]._M_allocated_capacity + 1));
  }
  if (local_1988[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_17d0);
    if ((undefined8 *)CONCAT71(local_1980.ptr_._1_7_,local_1980.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT71(local_1980.ptr_._1_7_,local_1980.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1960,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1cd,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1960,(Message *)local_17d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1960);
    if (local_17d0 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_17d0 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_17d0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1980,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_1908.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1908.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1908.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1908.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_18e0);
  cfd::TransactionContext::~TransactionContext(&local_1888);
  cfd::core::Address::~Address(&local_1b0);
  cfd::core::Address::~Address((Address *)local_d80);
  cfd::UtxoData::~UtxoData((UtxoData *)local_c00);
  cfd::UtxoData::~UtxoData(&local_6d8);
  local_18b0._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_0086bad8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_18b0.prefix_list_);
  return;
}

Assistant:

TEST(TransactionContext, SequenceApiTestWithKey)
{
  AddressFactory factory(NetType::kRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2pkhAddress;

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{180000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address("mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2("bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu");

  Amount fee(int64_t{10000});
  TransactionContext txc(2, 0);
  EXPECT_NO_THROW(txc.AddInput(utxo1));
  txc.AddTxIn(OutPoint(utxo2.txid, utxo2.vout));
  txc.AddTxOut(address, utxo1.amount - fee);
  txc.AddTxOut(address2, utxo2.amount);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));

  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), fee.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000");
}